

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus
analyseSetCreateError
          (HighsLogOptions *log_options,string *method,HighsInt create_error,bool ordered,
          HighsInt num_set_entries,HighsInt *set,HighsInt dimension)

{
  uint uVar1;
  undefined8 uVar2;
  byte in_CL;
  int in_EDX;
  HighsLogOptions *in_RDI;
  uint in_R8D;
  long in_R9;
  undefined4 in_stack_00000008;
  HighsInt illegal_set_entry;
  HighsInt illegal_set_index;
  
  if (in_EDX == 1) {
    uVar2 = std::__cxx11::string::c_str();
    highsLogUser(in_RDI,kError,"Set supplied to Highs::%s has illegal size of %d\n",uVar2,
                 (ulong)in_R8D);
  }
  else if (in_EDX == 3) {
    if ((in_CL & 1) == 0) {
      uVar2 = std::__cxx11::string::c_str();
      highsLogUser(in_RDI,kError,"Set supplied to Highs::%s not ordered\n",uVar2);
    }
    else {
      uVar2 = std::__cxx11::string::c_str();
      highsLogUser(in_RDI,kError,"Set supplied to Highs::%s contains duplicate entries\n",uVar2);
    }
  }
  else if (in_EDX < 0) {
    uVar1 = *(uint *)(in_R9 + (long)(int)(-in_EDX - 1U) * 4);
    uVar2 = std::__cxx11::string::c_str();
    highsLogUser(in_RDI,kError,"Set supplied to Highs::%s has entry %d of %d out of range [0, %d)\n"
                 ,uVar2,(ulong)(-in_EDX - 1U),(ulong)uVar1,in_stack_00000008);
  }
  return kError;
}

Assistant:

static HighsStatus analyseSetCreateError(HighsLogOptions log_options,
                                         const std::string method,
                                         const HighsInt create_error,
                                         const bool ordered,
                                         const HighsInt num_set_entries,
                                         const HighsInt* set,
                                         const HighsInt dimension) {
  if (create_error == kIndexCollectionCreateIllegalSetSize) {
    highsLogUser(log_options, HighsLogType::kError,
                 "Set supplied to Highs::%s has illegal size of %d\n",
                 method.c_str(), int(num_set_entries));
  } else if (create_error == kIndexCollectionCreateIllegalSetOrder) {
    if (ordered) {
      // Creating an index_collection data structure for the set
      // includes a test that the indices increase strictly. If this
      // is not the case then, since an increasing set was created
      // locally, it must contain duplicate entries. return with an
      // error
      highsLogUser(log_options, HighsLogType::kError,
                   "Set supplied to Highs::%s contains duplicate entries\n",
                   method.c_str());
    } else {
      highsLogUser(log_options, HighsLogType::kError,
                   "Set supplied to Highs::%s not ordered\n", method.c_str());
    }
  } else if (create_error < 0) {
    HighsInt illegal_set_index = -1 - create_error;
    HighsInt illegal_set_entry = set[illegal_set_index];
    highsLogUser(
        log_options, HighsLogType::kError,
        "Set supplied to Highs::%s has entry %d of %d out of range [0, %d)\n",
        method.c_str(), int(illegal_set_index), int(illegal_set_entry),
        int(dimension));
  }
  assert(create_error != kIndexCollectionCreateIllegalSetDimension);
  return HighsStatus::kError;
}